

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O0

void BulkTransaction(CMutableTransaction *tx,int32_t target_weight)

{
  size_type count;
  int32_t iVar1;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  iterator pos;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int dummy_vbytes;
  int32_t unpadded_weight;
  CTransaction *in_stack_fffffffffffffdb8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffdc0;
  CScript *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde8;
  opcodetype opcode;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  CTransaction *this_00;
  CTransaction local_a8;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  opcode = (opcodetype)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(in_RDI + 0x18);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  CScript::CScript((CScript *)in_stack_fffffffffffffdb8);
  pos.ptr = (uchar *)CScript::operator<<((CScript *)
                                         CONCAT44(in_stack_fffffffffffffdf4,
                                                  in_stack_fffffffffffffdf0),opcode);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            (in_stack_fffffffffffffdd8,
             (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdc8);
  CScript::~CScript((CScript *)in_stack_fffffffffffffdb8);
  this_00 = &local_a8;
  CTransaction::CTransaction
            (this_00,(CMutableTransaction *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  count = GetTransactionWeight(in_stack_fffffffffffffdb8);
  CTransaction::~CTransaction(in_stack_fffffffffffffdb8);
  if (in_ESI < (int)count) {
    __assert_fail("target_weight >= unpadded_weight",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                  ,0x4e,"void BulkTransaction(CMutableTransaction &, int32_t)");
  }
  GetSizeOfCompactSize(CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffdc8,
             (size_type)in_stack_fffffffffffffdc0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffdc8,
             (size_type)in_stack_fffffffffffffdc0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_fffffffffffffdc0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert(this,pos,count,(uchar *)this_00);
  CTransaction::CTransaction
            (this_00,(CMutableTransaction *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  iVar1 = GetTransactionWeight(in_stack_fffffffffffffdb8);
  if (iVar1 < in_ESI) {
    __assert_fail("GetTransactionWeight(CTransaction(tx)) >= target_weight",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                  ,0x5a,"void BulkTransaction(CMutableTransaction &, int32_t)");
  }
  CTransaction::~CTransaction(in_stack_fffffffffffffdb8);
  CTransaction::CTransaction
            (this_00,(CMutableTransaction *)CONCAT44(iVar1,in_stack_fffffffffffffdf0));
  iVar1 = GetTransactionWeight(in_stack_fffffffffffffdb8);
  if (in_ESI + 3 < iVar1) {
    __assert_fail("GetTransactionWeight(CTransaction(tx)) <= target_weight + 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                  ,0x5b,"void BulkTransaction(CMutableTransaction &, int32_t)");
  }
  CTransaction::~CTransaction(in_stack_fffffffffffffdb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BulkTransaction(CMutableTransaction& tx, int32_t target_weight)
{
    tx.vout.emplace_back(0, CScript() << OP_RETURN);
    auto unpadded_weight{GetTransactionWeight(CTransaction(tx))};
    assert(target_weight >= unpadded_weight);

    // determine number of needed padding bytes by converting weight difference to vbytes
    auto dummy_vbytes = (target_weight - unpadded_weight + (WITNESS_SCALE_FACTOR - 1)) / WITNESS_SCALE_FACTOR;
    // compensate for the increase of the compact-size encoded script length
    // (note that the length encoding of the unpadded output script needs one byte)
    dummy_vbytes -= GetSizeOfCompactSize(dummy_vbytes) - 1;

    // pad transaction by repeatedly appending a dummy opcode to the output script
    tx.vout[0].scriptPubKey.insert(tx.vout[0].scriptPubKey.end(), dummy_vbytes, OP_1);

    // actual weight should be at most 3 higher than target weight
    assert(GetTransactionWeight(CTransaction(tx)) >= target_weight);
    assert(GetTransactionWeight(CTransaction(tx)) <= target_weight + 3);
}